

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<Fad<double>,_3>::TPZManVector
          (TPZManVector<Fad<double>,_3> *this,TPZVec<Fad<double>_> *copy)

{
  ulong *puVar1;
  Fad<double> *pFVar2;
  long lVar3;
  ulong uVar4;
  Fad<double> *pFVar5;
  ulong uVar6;
  bool bVar7;
  
  (this->super_TPZVec<Fad<double>_>).fNAlloc = 0;
  (this->super_TPZVec<Fad<double>_>).fStore = (Fad<double> *)0x0;
  (this->super_TPZVec<Fad<double>_>).fNElements = 0;
  (this->super_TPZVec<Fad<double>_>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_016b0968;
  pFVar2 = this->fExtAlloc;
  lVar3 = 0;
  pFVar5 = pFVar2;
  do {
    Fad<double>::Fad(pFVar5);
    lVar3 = lVar3 + -0x20;
    pFVar5 = pFVar5 + 1;
  } while (lVar3 != -0x60);
  uVar4 = copy->fNElements;
  if ((long)uVar4 < 4) {
    uVar6 = 0;
  }
  else {
    puVar1 = (ulong *)operator_new__(-(ulong)(uVar4 >> 0x3b != 0) | uVar4 * 0x20 | 8);
    *puVar1 = uVar4;
    pFVar2 = (Fad<double> *)(puVar1 + 1);
    lVar3 = 0;
    pFVar5 = pFVar2;
    do {
      Fad<double>::Fad(pFVar5);
      lVar3 = lVar3 + -0x20;
      pFVar5 = pFVar5 + 1;
      uVar6 = uVar4;
    } while (-lVar3 != uVar4 * 0x20);
  }
  (this->super_TPZVec<Fad<double>_>).fStore = pFVar2;
  (this->super_TPZVec<Fad<double>_>).fNElements = uVar4;
  (this->super_TPZVec<Fad<double>_>).fNAlloc = uVar6;
  uVar6 = 0;
  if ((long)uVar4 < 1) {
    uVar4 = uVar6;
  }
  while (bVar7 = uVar4 != 0, uVar4 = uVar4 - 1, bVar7) {
    Fad<double>::operator=
              ((Fad<double> *)((long)&((this->super_TPZVec<Fad<double>_>).fStore)->val_ + uVar6),
               (Fad<double> *)((long)&copy->fStore->val_ + uVar6));
    uVar6 = uVar6 + 0x20;
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(
        const TPZVec<T> & copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= (int64_t) (sizeof (fExtAlloc) / sizeof (T))) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy[i];
    }
}